

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O0

void affect_strip(CHAR_DATA *ch,int sn)

{
  short *psVar1;
  undefined8 *puVar2;
  int in_ESI;
  long in_RDI;
  AFFECT_DATA *paf_next;
  AFFECT_DATA *paf;
  undefined4 in_stack_00000018;
  undefined8 local_18;
  
  local_18 = *(undefined8 **)(in_RDI + 0x88);
  while (local_18 != (undefined8 *)0x0) {
    puVar2 = (undefined8 *)*local_18;
    psVar1 = (short *)((long)local_18 + 0x1c);
    local_18 = puVar2;
    if (*psVar1 == in_ESI) {
      affect_remove(ch,(AFFECT_DATA *)CONCAT44(sn,in_stack_00000018));
    }
  }
  return;
}

Assistant:

void affect_strip(CHAR_DATA *ch, int sn)
{
	AFFECT_DATA *paf;
	AFFECT_DATA *paf_next;

	for (paf = ch->affected; paf != nullptr; paf = paf_next)
	{
		paf_next = paf->next;

		if (paf->type == sn)
		{
			affect_remove(ch, paf);
		}
	}
}